

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitRefCast(PrintExpressionContents *this,RefCast *curr)

{
  ostream *o;
  string_view local_28;
  RefCast *local_18;
  RefCast *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (RefCast *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"ref.cast ");
  printMedium(o,local_28);
  printType(this,(Type)(local_18->super_SpecificExpression<(wasm::Expression::Id)63>).
                       super_Expression.type.id);
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    printMedium(o, "ref.cast ");
    printType(curr->type);
  }